

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void Strsafe_init(void)

{
  s_x1 *__ptr;
  s_x1node *psVar1;
  long lVar2;
  
  if (x1a != (s_x1 *)0x0) {
    return;
  }
  __ptr = (s_x1 *)malloc(0x18);
  x1a = __ptr;
  if (__ptr != (s_x1 *)0x0) {
    __ptr->size = 0x400;
    __ptr->count = 0;
    psVar1 = (s_x1node *)calloc(0x400,0x20);
    __ptr->tbl = psVar1;
    if (psVar1 == (s_x1node *)0x0) {
      free(__ptr);
      x1a = (s_x1 *)0x0;
    }
    else {
      __ptr->ht = (s_x1node **)(psVar1 + 0x400);
      for (lVar2 = 0; lVar2 != 0x400; lVar2 = lVar2 + 1) {
        __ptr->ht[lVar2] = (s_x1node *)0x0;
      }
    }
  }
  return;
}

Assistant:

void Strsafe_init(void){
  if( x1a ) return;
  x1a = (struct s_x1*)malloc( sizeof(struct s_x1) );
  if( x1a ){
    x1a->size = 1024;
    x1a->count = 0;
    x1a->tbl = (x1node*)calloc(1024, sizeof(x1node) + sizeof(x1node*));
    if( x1a->tbl==0 ){
      free(x1a);
      x1a = 0;
    }else{
      int i;
      x1a->ht = (x1node**)&(x1a->tbl[1024]);
      for(i=0; i<1024; i++) x1a->ht[i] = 0;
    }
  }
}